

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O1

int yaml_string_read_handler(void *data,uchar *buffer,size_t size,size_t *size_read)

{
  void *__src;
  ulong __n;
  
  __src = *(void **)((long)data + 0x78);
  if (__src == *(void **)((long)data + 0x70)) {
    __n = 0;
  }
  else {
    __n = (long)*(void **)((long)data + 0x70) - (long)__src;
    if (size <= __n) {
      __n = size;
    }
    memcpy(buffer,__src,__n);
    *(long *)((long)data + 0x78) = *(long *)((long)data + 0x78) + __n;
  }
  *size_read = __n;
  return 1;
}

Assistant:

static int
yaml_string_read_handler(void *data, unsigned char *buffer, size_t size,
        size_t *size_read)
{
    yaml_parser_t *parser = (yaml_parser_t *)data;

    if (parser->input.string.current == parser->input.string.end) {
        *size_read = 0;
        return 1;
    }

    if (size > (size_t)(parser->input.string.end
                - parser->input.string.current)) {
        size = parser->input.string.end - parser->input.string.current;
    }

    memcpy(buffer, parser->input.string.current, size);
    parser->input.string.current += size;
    *size_read = size;
    return 1;
}